

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_tree_cleanup(mpack_tree_t *tree)

{
  mpack_tree_page_t *pmVar1;
  mpack_tree_page_t *next;
  mpack_tree_page_t *page;
  mpack_tree_t *tree_local;
  
  next = tree->next;
  while (next != (mpack_tree_page_t *)0x0) {
    pmVar1 = next->next;
    free(next);
    next = pmVar1;
  }
  tree->next = (mpack_tree_page_t *)0x0;
  return;
}

Assistant:

static void mpack_tree_cleanup(mpack_tree_t* tree) {
    MPACK_UNUSED(tree);

    #ifdef MPACK_MALLOC
    mpack_tree_page_t* page = tree->next;
    while (page != NULL) {
        mpack_tree_page_t* next = page->next;
        mpack_log("freeing page %p\n", page);
        MPACK_FREE(page);
        page = next;
    }
    tree->next = NULL;
    #endif
}